

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddBox
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,double hx,
          double hy,double hz,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ChCollisionShapeBullet *this_00;
  cbtCollisionShape *this_01;
  double dVar5;
  undefined8 in_XMM0_Qb;
  undefined8 uVar9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar10 [16];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  cbtVector3 local_40;
  
  dVar5 = hx;
  uVar9 = in_XMM0_Qb;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])();
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = hx;
  auVar6._0_8_ = (double)SUB84(dVar5,0);
  auVar6._8_8_ = uVar9;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = hy;
  auVar1 = vminsd_avx(auVar2,auVar1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = hz;
  auVar1 = vminsd_avx(auVar1,auVar7);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar1._0_8_ * 0.2;
  auVar7 = vminsd_avx(auVar6,auVar10);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(this);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,
             &material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,BOX,(shared_ptr<chrono::ChMaterialSurface> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  local_58 = auVar7;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  local_68 = auVar7;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  this_01 = (cbtCollisionShape *)cbtBoxShape::operator_new(0x50);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = hx;
  auVar1 = vinsertps_avx(local_58,ZEXT416((uint)local_68._0_4_),0x10);
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = hy;
  auVar2 = vunpcklpd_avx(auVar3,auVar4);
  auVar1 = vcvtps2pd_avx(auVar1);
  auVar8._0_8_ = auVar2._0_8_ + auVar1._0_8_;
  auVar8._8_8_ = auVar2._8_8_ + auVar1._8_8_;
  auVar1 = vcvtpd2ps_avx(auVar8);
  local_40.m_floats._0_8_ = vmovlps_avx(auVar1);
  local_40.m_floats[3] = 0.0;
  local_40.m_floats[2] = (float)((double)auVar7._0_4_ + hz);
  cbtBoxShape::cbtBoxShape((cbtBoxShape *)this_01,&local_40);
  this_00->m_bt_shape = this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*this_01->_vptr_cbtCollisionShape[0xb])(this_01);
  injectShape(this,pos,rot,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddBox(std::shared_ptr<ChMaterialSurface> material,
                                    double hx,
                                    double hy,
                                    double hz,
                                    const ChVector<>& pos,
                                    const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    SetSafeMargin(ChMin(GetSafeMargin(), 0.2 * ChMin(ChMin(hx, hy), hz)));

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::BOX, material);

    cbtScalar ahx = (cbtScalar)(hx + GetEnvelope());
    cbtScalar ahy = (cbtScalar)(hy + GetEnvelope());
    cbtScalar ahz = (cbtScalar)(hz + GetEnvelope());
    shape->m_bt_shape = new cbtBoxShape(cbtVector3(ahx, ahy, ahz));
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, rot, shape);
    return true;
}